

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int bc_atom_to_idx(BCWriterState *s,uint32_t *pres,JSAtom atom)

{
  uint32_t **parray;
  int *psize;
  uint32_t *puVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  
  uVar5 = atom - s->first_atom;
  iVar2 = 0;
  if (-1 < (int)atom && s->first_atom <= atom) {
    uVar4 = s->atom_to_idx_size;
    lVar3 = (long)(int)uVar4;
    parray = &s->atom_to_idx;
    if (uVar5 < uVar4) {
      atom = (*parray)[uVar5];
      iVar2 = 0;
      if (atom != 0) goto LAB_0013b7fa;
    }
    else {
      psize = &s->atom_to_idx_size;
      if (((int)uVar4 < (int)(uVar5 + 1)) &&
         (iVar2 = js_realloc_array(s->ctx,parray,4,psize,uVar5 + 1), iVar2 != 0)) {
        return -1;
      }
      if ((int)uVar4 < *psize) {
        puVar1 = *parray;
        do {
          puVar1[lVar3] = 0;
          lVar3 = lVar3 + 1;
        } while (lVar3 < *psize);
      }
    }
    uVar4 = s->idx_to_atom_count;
    if (s->idx_to_atom_size <= (int)uVar4) {
      iVar2 = js_realloc_array(s->ctx,&s->idx_to_atom,4,&s->idx_to_atom_size,uVar4 + 1);
      if (iVar2 != 0) {
        atom = 0;
        iVar2 = -1;
        goto LAB_0013b7fa;
      }
      uVar4 = s->idx_to_atom_count;
    }
    s->idx_to_atom_count = uVar4 + 1;
    s->idx_to_atom[uVar4] = uVar5 + s->first_atom;
    atom = uVar4 + s->first_atom;
    s->atom_to_idx[uVar5] = atom;
    iVar2 = 0;
  }
LAB_0013b7fa:
  *pres = atom;
  return iVar2;
}

Assistant:

static int bc_atom_to_idx(BCWriterState *s, uint32_t *pres, JSAtom atom)
{
    uint32_t v;

    if (atom < s->first_atom || __JS_AtomIsTaggedInt(atom)) {
        *pres = atom;
        return 0;
    }
    atom -= s->first_atom;
    if (atom < s->atom_to_idx_size && s->atom_to_idx[atom] != 0) {
        *pres = s->atom_to_idx[atom];
        return 0;
    }
    if (atom >= s->atom_to_idx_size) {
        int old_size, i;
        old_size = s->atom_to_idx_size;
        if (js_resize_array(s->ctx, (void **)&s->atom_to_idx,
                            sizeof(s->atom_to_idx[0]), &s->atom_to_idx_size,
                            atom + 1))
            return -1;
        /* XXX: could add a specific js_resize_array() function to do it */
        for(i = old_size; i < s->atom_to_idx_size; i++)
            s->atom_to_idx[i] = 0;
    }
    if (js_resize_array(s->ctx, (void **)&s->idx_to_atom,
                        sizeof(s->idx_to_atom[0]),
                        &s->idx_to_atom_size, s->idx_to_atom_count + 1))
        goto fail;

    v = s->idx_to_atom_count++;
    s->idx_to_atom[v] = atom + s->first_atom;
    v += s->first_atom;
    s->atom_to_idx[atom] = v;
    *pres = v;
    return 0;
 fail:
    *pres = 0;
    return -1;
}